

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_60e82::SharedLibraryShellCommand::configureAttribute
          (SharedLibraryShellCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  ConfigureContext *this_00;
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  bool local_7a1;
  string local_788;
  Twine local_768;
  Twine local_750;
  Twine local_738;
  char *local_720 [2];
  SharedLibraryShellCommand *local_710;
  char *local_708;
  char *local_700 [2];
  SharedLibraryShellCommand *local_6f0;
  char *local_6e8;
  char *local_6e0 [2];
  SharedLibraryShellCommand *local_6d0;
  char *local_6c8;
  char *local_6c0 [2];
  void *local_6b0;
  size_t local_6a8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_699;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_698;
  StringRef local_680;
  StringRef local_670;
  undefined1 local_660 [8];
  SmallVector<llvm::StringRef,_32U> args;
  string local_430;
  char *local_410 [2];
  char *local_400;
  size_t local_3f8;
  ConfigureContext *local_3f0;
  ConfigureContext *ctx_local;
  SharedLibraryShellCommand *this_local;
  StringRef value_local;
  StringRef name_local;
  SharedLibraryShellCommand *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  SharedLibraryShellCommand *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  SharedLibraryShellCommand *local_280;
  char *local_278;
  char *local_270;
  size_t local_268;
  char *local_260;
  size_t local_258;
  void *local_250;
  size_t local_248;
  char local_240 [8];
  size_t local_238;
  char local_230 [8];
  size_t local_228;
  size_t local_220;
  size_t local_218;
  char *local_210;
  size_t local_208;
  char *local_200;
  size_t local_1f8;
  char *local_1f0;
  size_t local_1e8;
  char **local_1e0;
  char *local_1d8;
  size_t local_1d0;
  size_t *local_1c8;
  char local_1c0 [8];
  size_t local_1b8;
  void **local_1b0;
  char *local_1a8;
  size_t local_1a0;
  SharedLibraryShellCommand **local_198;
  char *local_190;
  char *local_188;
  SharedLibraryShellCommand **local_180;
  char *local_178;
  char *local_170;
  SharedLibraryShellCommand **local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  SharedLibraryShellCommand *local_140;
  int local_134;
  char *local_130;
  char *local_128;
  SharedLibraryShellCommand *local_120;
  int local_114;
  char *local_110;
  char *local_108;
  SharedLibraryShellCommand *local_100;
  int local_f4;
  size_t local_f0;
  char *local_e8;
  void *local_e0;
  int local_d4;
  size_t local_d0;
  char local_c8 [8];
  size_t local_c0;
  int local_b4;
  size_t local_b0;
  char *local_a8;
  char *local_a0;
  int local_94;
  char *local_90;
  char **local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  StringRef *local_68;
  char *local_60;
  char **local_58;
  char *local_50;
  char **local_48;
  char *local_40;
  char **local_38;
  char *local_30;
  char **local_28;
  undefined1 *local_20;
  SmallVectorBase *local_18;
  SmallVectorBase *local_10;
  
  value_local.Data = (char *)value.Length;
  this_local = (SharedLibraryShellCommand *)value.Data;
  sVar2 = name.Length;
  local_400 = name.Data;
  local_88 = local_410;
  local_90 = "executable";
  local_410[0] = "executable";
  local_3f8 = sVar2;
  local_3f0 = ctx;
  ctx_local = (ConfigureContext *)this;
  value_local.Length = (size_t)local_400;
  local_208 = strlen("executable");
  local_1f0 = local_400;
  local_1e8 = local_3f8;
  local_200 = local_410[0];
  local_210 = local_410[0];
  local_1d8 = local_410[0];
  local_1e0 = &local_1f0;
  local_7a1 = false;
  local_1f8 = local_208;
  local_1d0 = local_208;
  if (local_3f8 == local_208) {
    local_a0 = local_400;
    local_a8 = local_410[0];
    local_b0 = local_208;
    if (local_208 == 0) {
      local_94 = 0;
    }
    else {
      local_94 = memcmp(local_400,local_410[0],local_208);
    }
    local_7a1 = local_94 == 0;
  }
  sVar1 = value_local.Length;
  if (local_7a1) {
    llvm::StringRef::operator_cast_to_string(&local_430,(StringRef *)&this_local);
    std::__cxx11::string::operator=((string *)&this->executable,(string *)&local_430);
    std::__cxx11::string::~string((string *)&local_430);
  }
  else {
    local_78 = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
               super_AlignedCharArray<8UL,_16UL>.buffer + 8;
    local_80 = "other-args";
    args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
    super_AlignedCharArray<8UL,_16UL>.buffer._8_8_ = anon_var_dwarf_5b365;
    local_238 = strlen("other-args");
    local_220 = sVar1;
    local_230[0] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[8];
    local_230[1] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[9];
    local_230[2] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[10];
    local_230[3] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
    local_230[4] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
    local_230[5] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
    local_230[6] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
    local_230[7] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
    local_240[0] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[8];
    local_240[1] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[9];
    local_240[2] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[10];
    local_240[3] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
    local_240[4] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
    local_240[5] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
    local_240[6] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
    local_240[7] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
    local_1c0[0] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[8];
    local_1c0[1] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[9];
    local_1c0[2] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[10];
    local_1c0[3] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
    local_1c0[4] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
    local_1c0[5] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
    local_1c0[6] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
    local_1c0[7] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                   super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
    local_1c8 = &local_220;
    bVar3 = false;
    local_228 = local_238;
    local_218 = sVar2;
    local_1b8 = local_238;
    if (sVar2 == local_238) {
      local_c0 = sVar1;
      local_c8[0] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                    super_AlignedCharArray<8UL,_16UL>.buffer[8];
      local_c8[1] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                    super_AlignedCharArray<8UL,_16UL>.buffer[9];
      local_c8[2] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                    super_AlignedCharArray<8UL,_16UL>.buffer[10];
      local_c8[3] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                    super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
      local_c8[4] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                    super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
      local_c8[5] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                    super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
      local_c8[6] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                    super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
      local_c8[7] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                    super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
      local_d0 = local_238;
      if (local_238 == 0) {
        local_b4 = 0;
      }
      else {
        local_b4 = memcmp((void *)sVar1,
                          (void *)args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts
                                  [0x1f].super_AlignedCharArray<8UL,_16UL>.buffer._8_8_,local_238);
      }
      bVar3 = local_b4 == 0;
    }
    if (bVar3) {
      llvm::SmallVector<llvm::StringRef,_32U>::SmallVector
                ((SmallVector<llvm::StringRef,_32U> *)local_660);
      local_670.Data = (char *)this_local;
      local_670.Length = (size_t)value_local.Data;
      local_68 = &local_680;
      local_70 = " ";
      strlen(" ");
      llvm::StringRef::split
                (&local_670,(SmallVectorImpl<llvm::StringRef> *)local_660,local_680,-1,false);
      local_20 = local_660;
      local_18 = (SmallVectorBase *)local_660;
      local_10 = local_18;
      sVar1 = llvm::SmallVectorBase::size(local_18);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_699);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<llvm::StringRef*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_698,
                 (StringRef *)local_660,(StringRef *)((long)local_660 + sVar1 * 0x10),&local_699);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->otherArgs,&local_698);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_698);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_699);
      llvm::SmallVector<llvm::StringRef,_32U>::~SmallVector
                ((SmallVector<llvm::StringRef,_32U> *)local_660);
    }
    else {
      local_6b0 = (void *)value_local.Length;
      local_58 = local_6c0;
      local_60 = "compiler-style";
      local_6c0[0] = "compiler-style";
      local_6a8 = sVar2;
      local_268 = strlen("compiler-style");
      local_250 = local_6b0;
      local_248 = local_6a8;
      local_260 = local_6c0[0];
      local_270 = local_6c0[0];
      local_1a8 = local_6c0[0];
      local_1b0 = &local_250;
      bVar3 = false;
      local_258 = local_268;
      local_1a0 = local_268;
      if (local_6a8 == local_268) {
        local_e0 = local_6b0;
        local_e8 = local_6c0[0];
        local_f0 = local_268;
        if (local_268 == 0) {
          local_d4 = 0;
        }
        else {
          local_d4 = memcmp(local_6b0,local_6c0[0],local_268);
        }
        bVar3 = local_d4 == 0;
      }
      if (bVar3) {
        local_6d0 = this_local;
        local_6c8 = value_local.Data;
        local_48 = local_6e0;
        local_50 = "cl";
        local_6e0[0] = "cl";
        local_158 = (char *)strlen("cl");
        local_2e0 = local_6d0;
        local_2d8 = local_6c8;
        local_160 = local_6e0[0];
        local_168 = &local_2e0;
        bVar3 = false;
        if (local_6c8 == local_158) {
          local_140 = local_6d0;
          local_148 = local_6e0[0];
          local_150 = local_158;
          if (local_158 == (char *)0x0) {
            local_134 = 0;
          }
          else {
            local_134 = memcmp(local_6d0,local_6e0[0],(size_t)local_158);
          }
          bVar3 = local_134 == 0;
        }
        bVar4 = false;
        if (!bVar3) {
          local_6f0 = this_local;
          local_6e8 = value_local.Data;
          local_38 = local_700;
          local_40 = "clang";
          local_700[0] = "clang";
          local_2c8 = (char *)strlen("clang");
          local_2b0 = local_6f0;
          local_2a8 = local_6e8;
          local_2c0 = local_700[0];
          local_2d0 = local_700[0];
          local_178 = local_700[0];
          local_180 = &local_2b0;
          bVar3 = false;
          local_2b8 = local_2c8;
          local_170 = local_2c8;
          if (local_6e8 == local_2c8) {
            local_120 = local_6f0;
            local_128 = local_700[0];
            local_130 = local_2c8;
            if (local_2c8 == (char *)0x0) {
              local_114 = 0;
            }
            else {
              local_114 = memcmp(local_6f0,local_700[0],(size_t)local_2c8);
            }
            bVar3 = local_114 == 0;
          }
          bVar4 = false;
          if (!bVar3) {
            local_710 = this_local;
            local_708 = value_local.Data;
            local_28 = local_720;
            local_30 = "swiftc";
            local_720[0] = "swiftc";
            local_298 = (char *)strlen("swiftc");
            local_280 = local_710;
            local_278 = local_708;
            local_290 = local_720[0];
            local_2a0 = local_720[0];
            local_190 = local_720[0];
            local_198 = &local_280;
            bVar4 = false;
            local_288 = local_298;
            local_188 = local_298;
            if (local_708 == local_298) {
              local_100 = local_710;
              local_108 = local_720[0];
              local_110 = local_298;
              if (local_298 == (char *)0x0) {
                local_f4 = 0;
              }
              else {
                local_f4 = memcmp(local_710,local_720[0],(size_t)local_298);
              }
              bVar4 = local_f4 == 0;
            }
            bVar4 = (bool)(bVar4 ^ 1);
          }
        }
        this_00 = local_3f0;
        if (bVar4) {
          llvm::operator+(&local_750,"Unsupported : compiler-style\'",(StringRef *)&this_local);
          llvm::Twine::Twine(&local_768,
                             "\' for shared libraries\'.  Supported styles are cl, clang, and swiftc"
                            );
          llvm::operator+(&local_738,&local_750,&local_768);
          llbuild::buildsystem::ConfigureContext::error(this_00,&local_738);
        }
        llvm::StringRef::operator_cast_to_string(&local_788,(StringRef *)&this_local);
        std::__cxx11::string::operator=((string *)&this->compilerStyle,(string *)&local_788);
        std::__cxx11::string::~string((string *)&local_788);
      }
    }
  }
  return true;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "executable") {
      executable = value;
    } else if (name == "other-args") {
      SmallVector<StringRef, 32> args;
      StringRef(value).split(args, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      otherArgs = std::vector<std::string>(args.begin(), args.end());
    } else if (name == "compiler-style") {
      if (value != "cl" && value != "clang" && value != "swiftc") {
        ctx.error("Unsupported : compiler-style'" + value +
                  "' for shared libraries'.  Supported styles are cl, clang, "
                  "and swiftc");
      }
      compilerStyle = value;
    }
    return true;
  }